

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall QAbstractSpinBox::keyPressEvent(QAbstractSpinBox *this,QKeyEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  QArrayData *pQVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  Int IVar5;
  int iVar6;
  KeyboardModifier KVar7;
  uint uVar8;
  QStyle *pQVar9;
  int iVar10;
  QLineEdit *this_01;
  long in_FS_OFFSET;
  bool bVar11;
  bool bVar12;
  QStringView QVar13;
  QLatin1String QVar14;
  QAccessibleValueChangeEvent event_1;
  QString local_90;
  QString local_78;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  IVar5 = QKeyEvent::modifiers();
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = IVar5;
  pQVar1 = *(QArrayData **)(event + 0x28);
  lVar2 = *(long *)(event + 0x38);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar2 == 0) {
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  else {
    iVar6 = QLineEdit::cursorPosition(this_00->edit);
    lVar2 = (this_00->prefix).d.size;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    if (iVar6 < lVar2) {
      QLineEdit::setCursorPosition(this_00->edit,(int)(this_00->prefix).d.size);
    }
  }
  iVar6 = *(int *)(event + 0x40);
  iVar10 = 1;
  bVar3 = false;
  switch(iVar6) {
  case 0x1000004:
  case 0x1000005:
    lVar2 = *(long *)(*(long *)&(this_00->edit->super_QWidget).field_0x8 + 600);
    if (*(long *)(lVar2 + 0x100) != *(long *)(lVar2 + 0xf8)) {
      *(long *)(lVar2 + 0x100) = *(long *)(lVar2 + 0xf8);
    }
    *(undefined8 *)(lVar2 + 0xf0) = 0;
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xd0))
              (this_00,*(uint *)&this_00->field_0x3d0 >> 6 & 1);
    selectAll(this);
    event[0xc] = (QKeyEvent)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)0x0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QLineEdit::returnPressed(this_00->edit);
      return;
    }
    goto LAB_00482484;
  case 0x1000006:
  case 0x1000007:
  case 0x1000008:
  case 0x1000009:
  case 0x100000a:
  case 0x100000b:
  case 0x100000c:
  case 0x100000d:
  case 0x100000e:
  case 0x100000f:
  case 0x1000012:
  case 0x1000014:
switchD_00481fd8_caseD_1000006:
    cVar4 = QKeyEvent::matches((StandardKey)event);
    if (cVar4 == '\0') goto LAB_004823ff;
    selectAll(this);
    event[0xc] = (QKeyEvent)0x1;
    break;
  case 0x1000010:
  case 0x1000011:
    uVar8 = QKeyEvent::modifiers();
    if ((uVar8 >> 0x19 & 1) != 0) {
      iVar6 = QLineEdit::cursorPosition(this_00->edit);
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QLineEdit::displayText(&local_78,this_00->edit);
      if (*(int *)(event + 0x40) == 0x1000011) {
        if (((iVar6 != 0) || ((this_00->prefix).d.size == 0)) &&
           (lVar2 = (this_00->suffix).d.size, (long)iVar6 < local_78.d.size - lVar2)) {
          this_01 = this_00->edit;
          iVar10 = (int)local_78.d.size - ((int)lVar2 + iVar6);
LAB_0048238f:
          QLineEdit::setSelection(this_01,iVar6,iVar10);
          event[0xc] = (QKeyEvent)0x1;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          break;
        }
      }
      else if ((((QAbstractSpinBox *)local_78.d.size != (QAbstractSpinBox *)(long)iVar6) ||
               ((this_00->suffix).d.size == 0)) && (lVar2 = (this_00->prefix).d.size, lVar2 < iVar6)
              ) {
        this_01 = this_00->edit;
        iVar10 = (int)lVar2 - iVar6;
        goto LAB_0048238f;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
LAB_004823ff:
    (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x28))(this_00->edit,event);
    QLineEdit::text(&local_90,this_00->edit);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_90.d.size != 0) {
      this_00->field_0x3d0 = this_00->field_0x3d0 & 0x7f;
    }
    if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) == 0) {
      this_00->field_0x3d1 = this_00->field_0x3d1 | 1;
    }
    break;
  case 0x1000016:
  case 0x1000017:
    iVar10 = 10;
    bVar3 = true;
  case 0x1000013:
  case 0x1000015:
    event[0xc] = (QKeyEvent)0x1;
    bVar11 = iVar6 == 0x1000016;
    bVar12 = iVar6 == 0x1000013;
    uVar8 = (**(code **)(*(long *)this + 0x1c8))();
    if ((uVar8 & 2 - (bVar12 || bVar11)) != 0) {
      iVar6 = iVar10;
      if (!bVar3) {
        KVar7 = QKeyEvent::modifiers();
        iVar6 = iVar10 * 10;
        if ((this_00->stepModifier & KVar7) == NoModifier) {
          iVar6 = iVar10;
        }
      }
      iVar10 = -iVar6;
      if (bVar12 || bVar11) {
        iVar10 = iVar6;
      }
      pQVar9 = QWidget::style((QWidget *)this);
      iVar6 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x2a,0,this,0);
      if (iVar6 != 0) {
        this_00->buttonState = (uint)(!bVar12 && !bVar11) * 0x10 + 0x11;
      }
      if ((this_00->spinClickTimer).m_id == Invalid) {
        (**(code **)(*(long *)this + 0x1b0))(this,iVar10);
      }
      if (((!bVar3 && *(short *)(event + 0x50) < 0) &&
          ((this_00->spinClickThresholdTimer).m_id == Invalid)) &&
         ((this_00->spinClickTimer).m_id == Invalid)) {
        QAbstractSpinBoxPrivate::updateState(this_00,bVar12 || bVar11,true);
      }
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr._0_4_ = 0x80c1;
      local_78.d.ptr._4_4_ = 0xaaaaaaaa;
      uStack_60 = 0xaaaaaaaaffffffff;
      local_78.d.d = (Data *)QTextDocument::setMarkdown;
      local_78.d.size = (qsizetype)this;
      ::QVariant::QVariant((QVariant *)&local_58,&this_00->value);
      local_78.d.ptr = (char16_t *)CONCAT44(local_78.d.ptr._4_4_,0x800e);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)&local_78);
    }
    break;
  default:
    if (iVar6 != 0x55) goto switchD_00481fd8_caseD_1000006;
    uVar8 = QKeyEvent::modifiers();
    if (((uVar8 >> 0x1a & 1) == 0) ||
       (QGuiApplication::platformName(),
       (QAbstractSpinBox *)local_78.d.size != (QAbstractSpinBox *)0x3)) {
      cVar4 = '\0';
    }
    else {
      QVar13.m_data = local_78.d.ptr;
      QVar13.m_size = 3;
      QVar14.m_data = "xcb";
      QVar14.m_size = 3;
      cVar4 = QtPrivate::equalStrings(QVar13,QVar14);
    }
    if (((uVar8 >> 0x1a & 1) != 0) && (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (cVar4 == '\0') goto LAB_004823ff;
    event[0xc] = (QKeyEvent)0x1;
    if ((*(byte *)(*(long *)(this + 8) + 0x3d0) & 2) == 0) {
      (**(code **)(*(long *)this + 0x1b8))(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00482484:
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::keyPressEvent(QKeyEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();

    if (!event->text().isEmpty() && d->edit->cursorPosition() < d->prefix.size())
        d->edit->setCursorPosition(d->prefix.size());

    int steps = 1;
    bool isPgUpOrDown = false;
    switch (event->key()) {
    case Qt::Key_PageUp:
    case Qt::Key_PageDown:
        steps *= 10;
        isPgUpOrDown = true;
        Q_FALLTHROUGH();
    case Qt::Key_Up:
    case Qt::Key_Down: {
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            // Reserve up/down for nav - use left/right for edit.
            if (!hasEditFocus() && (event->key() == Qt::Key_Up
                                    || event->key() == Qt::Key_Down)) {
                event->ignore();
                return;
            }
        }
#endif
        event->accept();
        const bool up = (event->key() == Qt::Key_PageUp || event->key() == Qt::Key_Up);
        if (!(stepEnabled() & (up ? StepUpEnabled : StepDownEnabled)))
            return;
        if (!isPgUpOrDown && (event->modifiers() & d->stepModifier))
            steps *= 10;
        if (!up)
            steps *= -1;
        if (style()->styleHint(QStyle::SH_SpinBox_AnimateButton, nullptr, this)) {
            d->buttonState = (Keyboard | (up ? Up : Down));
        }
        if (!d->spinClickTimer.isActive())
            stepBy(steps);
        if (event->isAutoRepeat() && !isPgUpOrDown) {
            if (!d->spinClickThresholdTimer.isActive() && !d->spinClickTimer.isActive()) {
                d->updateState(up, true);
            }
        }
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(this, d->value);
        QAccessible::updateAccessibility(&event);
#endif
        return;
    }
#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Left:
    case Qt::Key_Right:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            event->ignore();
            return;
        }
        break;
    case Qt::Key_Back:
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            event->ignore();
            return;
        }
        break;
#endif
    case Qt::Key_Enter:
    case Qt::Key_Return:
        d->edit->d_func()->control->clearUndo();
        d->interpret(d->keyboardTracking ? AlwaysEmit : EmitIfChanged);
        selectAll();
        event->ignore();
        emit editingFinished();
        emit returnPressed();
        emit d->edit->returnPressed();
        return;

#ifdef QT_KEYPAD_NAVIGATION
    case Qt::Key_Select:
        if (QApplicationPrivate::keypadNavigationEnabled()) {
            // Toggles between left/right moving cursor and inc/dec.
            setEditFocus(!hasEditFocus());
        }
        return;
#endif

    case Qt::Key_U:
        if (event->modifiers() & Qt::ControlModifier
            && QGuiApplication::platformName() == "xcb"_L1) { // only X11
            event->accept();
            if (!isReadOnly())
                clear();
            return;
        }
        break;

    case Qt::Key_End:
    case Qt::Key_Home:
        if (event->modifiers() & Qt::ShiftModifier) {
            int currentPos = d->edit->cursorPosition();
            const QString text = d->edit->displayText();
            if (event->key() == Qt::Key_End) {
                if ((currentPos == 0 && !d->prefix.isEmpty()) || text.size() - d->suffix.size() <= currentPos) {
                    break; // let lineedit handle this
                } else {
                    d->edit->setSelection(currentPos, text.size() - d->suffix.size() - currentPos);
                }
            } else {
                if ((currentPos == text.size() && !d->suffix.isEmpty()) || currentPos <= d->prefix.size()) {
                    break; // let lineedit handle this
                } else {
                    d->edit->setSelection(currentPos, d->prefix.size() - currentPos);
                }
            }
            event->accept();
            return;
        }
        break;

    default:
#ifndef QT_NO_SHORTCUT
        if (event == QKeySequence::SelectAll) {
            selectAll();
            event->accept();
            return;
        }
#endif
        break;
    }

    d->edit->event(event);
    if (!d->edit->text().isEmpty())
        d->cleared = false;
    if (!isVisible())
        d->ignoreUpdateEdit = true;
}